

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int tinyexr::RoundLog2(int x,int tile_rounding_mode)

{
  int r;
  int iVar1;
  int y;
  int iVar2;
  
  if (tile_rounding_mode == 0) {
    iVar1 = 0;
    for (; 1 < (uint)x; x = (uint)x >> 1) {
      iVar1 = iVar1 + 1;
    }
  }
  else {
    iVar2 = 0;
    iVar1 = 0;
    for (; 1 < (uint)x; x = (uint)x >> 1) {
      if ((x & 1U) != 0) {
        iVar1 = 1;
      }
      iVar2 = iVar2 + 1;
    }
    iVar1 = iVar1 + iVar2;
  }
  return iVar1;
}

Assistant:

static int RoundLog2(int x, int tile_rounding_mode) {
  return (tile_rounding_mode == TINYEXR_TILE_ROUND_DOWN) ? FloorLog2(static_cast<unsigned>(x)) : CeilLog2(static_cast<unsigned>(x));
}